

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::compute(dxt1_endpoint_optimizer *this,params *p,results *r)

{
  long in_RSI;
  long *in_RDI;
  dxt1_endpoint_optimizer *in_stack_00000138;
  results *in_stack_00000c90;
  params *in_stack_00000c98;
  dxt1_endpoint_optimizer *in_stack_00000ca0;
  undefined1 local_1;
  
  if (*(long *)(in_RSI + 8) == 0) {
    local_1 = false;
  }
  else {
    compute_internal(in_stack_00000ca0,in_stack_00000c98,in_stack_00000c90);
    if ((((*(byte *)(*in_RDI + 0x1d) & 1) == 0) || ((*(byte *)(*in_RDI + 0x21) & 1) == 0)) ||
       ((*(byte *)(*in_RDI + 0x1c) & 1) != 0)) {
      local_1 = true;
    }
    else {
      local_1 = try_alpha_as_black_optimization(in_stack_00000138);
    }
  }
  return local_1;
}

Assistant:

bool dxt1_endpoint_optimizer::compute(const params& p, results& r) {
  if (!p.m_pPixels)
    return false;
  compute_internal(p, r);
  if (m_pParams->m_use_alpha_blocks && m_pParams->m_use_transparent_indices_for_black && !m_pParams->m_pixels_have_alpha)
    return try_alpha_as_black_optimization();
  return true;
}